

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_init(cubeb_conflict *context,cubeb_stream_conflict **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict data_callback,
                     cubeb_state_callback_conflict state_callback,void *user_ptr)

{
  int iVar1;
  pa_sample_spec *ppVar2;
  pa_sample_spec *ppVar3;
  pa_buffer_attr *ppVar4;
  char *in_RCX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_R8;
  char *in_R9;
  long in_stack_00000008;
  undefined8 in_stack_00000018;
  undefined4 uStack0000000000000020;
  undefined1 uStack0000000000000024;
  undefined3 uStack0000000000000025;
  pa_buffer_attr *input_att;
  pa_buffer_attr *output_att;
  int r;
  pa_buffer_attr battr;
  cubeb_stream_conflict *stm;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  cubeb_stream_conflict *in_stack_ffffffffffffff58;
  pa_sample_spec *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  uint latency_frames_00;
  int local_58;
  pa_buffer_attr local_54;
  pa_sample_spec *local_40;
  char *local_38;
  long local_30;
  char *local_28;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  latency_frames_00 = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (in_RDI == 0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                  ,0x3aa,
                  "int pulse_stream_init(cubeb *, cubeb_stream **, const char *, cubeb_devid, cubeb_stream_params *, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                 );
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((*(int *)(in_RDI + 0x30) == 1) &&
     (iVar1 = pulse_context_init((cubeb_conflict *)in_stack_ffffffffffffff58), iVar1 != 0)) {
    local_4 = -1;
  }
  else {
    *local_18 = 0;
    local_40 = (pa_sample_spec *)calloc(1,0x60);
    if (local_40 == (pa_sample_spec *)0x0) {
      __assert_fail("stm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x3b4,
                    "int pulse_stream_init(cubeb *, cubeb_stream **, const char *, cubeb_devid, cubeb_stream_params *, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                   );
    }
    local_40->format = (undefined4)local_10;
    local_40->rate = local_10._4_4_;
    *(undefined8 *)&local_40[2].channels = in_stack_00000018;
    local_40[3].rate = uStack0000000000000020;
    local_40[3].channels = uStack0000000000000024;
    *(undefined3 *)&local_40[3].field_0x9 = uStack0000000000000025;
    *(pa_buffer_attr **)&local_40->channels = input_att;
    local_40[7].format = 0xbf800000;
    local_40[7].rate = 0xffffffff;
    if (*(int *)&local_40[6].channels != 0) {
      __assert_fail("stm->shutdown == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                    ,0x3bc,
                    "int pulse_stream_init(cubeb *, cubeb_stream **, const char *, cubeb_devid, cubeb_stream_params *, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                   );
    }
    (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*(long *)local_40 + 0x10));
    if (in_stack_00000008 != 0) {
      iVar1 = create_pa_stream(stm,(pa_stream **)battr._12_8_,(cubeb_stream_params *)battr._4_8_,_r)
      ;
      if (iVar1 != 0) {
        (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*(long *)local_40 + 0x10));
        pulse_stream_destroy((cubeb_stream_conflict *)0x111c44);
        return iVar1;
      }
      in_stack_ffffffffffffff68 = local_40;
      ppVar2 = (*cubeb_pa_stream_get_sample_spec)(*(pa_stream **)&local_40[1].rate);
      *(undefined8 *)&in_stack_ffffffffffffff68[4].channels = *(undefined8 *)ppVar2;
      in_stack_ffffffffffffff68[5].rate = *(uint32_t *)&ppVar2->channels;
      (*cubeb_pa_stream_set_state_callback)
                (*(pa_stream **)&local_40[1].rate,stream_state_callback,local_40);
      (*cubeb_pa_stream_set_write_callback)
                (*(pa_stream **)&local_40[1].rate,stream_write_callback,local_40);
      set_buffering_attribute(latency_frames_00,in_stack_ffffffffffffff68);
      (*cubeb_pa_stream_connect_playback)
                (*(pa_stream **)&local_40[1].rate,local_38,&local_54,
                 PA_STREAM_ADJUST_LATENCY|PA_STREAM_AUTO_TIMING_UPDATE|PA_STREAM_INTERPOLATE_TIMING|
                 PA_STREAM_START_CORKED,(pa_cvolume *)0x0,(pa_stream *)0x0);
    }
    if (local_30 != 0) {
      iVar1 = create_pa_stream(stm,(pa_stream **)battr._12_8_,(cubeb_stream_params *)battr._4_8_,_r)
      ;
      ppVar2 = local_40;
      if (iVar1 != 0) {
        (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*(long *)local_40 + 0x10));
        pulse_stream_destroy((cubeb_stream_conflict *)0x111d80);
        return iVar1;
      }
      ppVar3 = (*cubeb_pa_stream_get_sample_spec)(*(pa_stream **)(local_40 + 2));
      *(undefined8 *)&ppVar2[5].channels = *(undefined8 *)ppVar3;
      ppVar2[6].rate = *(uint32_t *)&ppVar3->channels;
      (*cubeb_pa_stream_set_state_callback)
                (*(pa_stream **)(local_40 + 2),stream_state_callback,local_40);
      (*cubeb_pa_stream_set_read_callback)
                (*(pa_stream **)(local_40 + 2),stream_read_callback,local_40);
      set_buffering_attribute(latency_frames_00,in_stack_ffffffffffffff68);
      (*cubeb_pa_stream_connect_record)
                (*(pa_stream **)(local_40 + 2),local_28,&local_54,
                 PA_STREAM_ADJUST_LATENCY|PA_STREAM_AUTO_TIMING_UPDATE|PA_STREAM_INTERPOLATE_TIMING|
                 PA_STREAM_START_CORKED);
    }
    local_58 = wait_until_stream_ready
                         ((cubeb_stream_conflict *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (local_58 == 0) {
      local_58 = stream_update_timing_info(in_stack_ffffffffffffff58);
    }
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*(long *)local_40 + 0x10));
    if (local_58 == 0) {
      if (g_cubeb_log_level != CUBEB_LOG_DISABLED) {
        if (((in_stack_00000008 != 0) &&
            (ppVar4 = (*cubeb_pa_stream_get_buffer_attr)(*(pa_stream **)&local_40[1].rate),
            g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
           (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Output buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
                     ,"cubeb_pulse.c",0x406,(ulong)ppVar4->maxlength,(ulong)ppVar4->tlength,
                     (ulong)ppVar4->prebuf,ppVar4->minreq,ppVar4->fragsize);
        }
        if (((local_30 != 0) &&
            (ppVar4 = (*cubeb_pa_stream_get_buffer_attr)(*(pa_stream **)(local_40 + 2)),
            g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
           (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Input buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
                     ,"cubeb_pulse.c",0x40f,(ulong)ppVar4->maxlength,(ulong)ppVar4->tlength,
                     (ulong)ppVar4->prebuf,ppVar4->minreq,ppVar4->fragsize);
        }
      }
      *local_18 = local_40;
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
         (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Cubeb stream (%p) init successful.\n","cubeb_pulse.c",0x414,*local_18);
      }
      local_4 = 0;
    }
    else {
      pulse_stream_destroy((cubeb_stream_conflict *)0x111ea0);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
pulse_stream_init(cubeb * context, cubeb_stream ** stream,
                  char const * stream_name, cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback, void * user_ptr)
{
  cubeb_stream * stm;
  pa_buffer_attr battr;
  int r;

  assert(context);

  // If the connection failed for some reason, try to reconnect
  if (context->error == 1 && pulse_context_init(context) != 0) {
    return CUBEB_ERROR;
  }

  *stream = NULL;

  stm = calloc(1, sizeof(*stm));
  assert(stm);

  stm->context = context;
  stm->data_callback = data_callback;
  stm->state_callback = state_callback;
  stm->user_ptr = user_ptr;
  stm->volume = PULSE_NO_GAIN;
  stm->state = -1;
  assert(stm->shutdown == 0);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (output_stream_params) {
    r = create_pa_stream(stm, &stm->output_stream, output_stream_params,
                         stream_name);
    if (r != CUBEB_OK) {
      WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
      pulse_stream_destroy(stm);
      return r;
    }

    stm->output_sample_spec =
        *(WRAP(pa_stream_get_sample_spec)(stm->output_stream));

    WRAP(pa_stream_set_state_callback)
    (stm->output_stream, stream_state_callback, stm);
    WRAP(pa_stream_set_write_callback)
    (stm->output_stream, stream_write_callback, stm);

    battr = set_buffering_attribute(latency_frames, &stm->output_sample_spec);
    WRAP(pa_stream_connect_playback)
    (stm->output_stream, (char const *)output_device, &battr,
     PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_INTERPOLATE_TIMING |
         PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY,
     NULL, NULL);
  }

  // Set up input stream
  if (input_stream_params) {
    r = create_pa_stream(stm, &stm->input_stream, input_stream_params,
                         stream_name);
    if (r != CUBEB_OK) {
      WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
      pulse_stream_destroy(stm);
      return r;
    }

    stm->input_sample_spec =
        *(WRAP(pa_stream_get_sample_spec)(stm->input_stream));

    WRAP(pa_stream_set_state_callback)
    (stm->input_stream, stream_state_callback, stm);
    WRAP(pa_stream_set_read_callback)
    (stm->input_stream, stream_read_callback, stm);

    battr = set_buffering_attribute(latency_frames, &stm->input_sample_spec);
    WRAP(pa_stream_connect_record)
    (stm->input_stream, (char const *)input_device, &battr,
     PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_INTERPOLATE_TIMING |
         PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY);
  }

  r = wait_until_stream_ready(stm);
  if (r == 0) {
    /* force a timing update now, otherwise timing info does not become valid
       until some point after initialization has completed. */
    r = stream_update_timing_info(stm);
  }

  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  if (r != 0) {
    pulse_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  if (g_cubeb_log_level) {
    if (output_stream_params) {
      const pa_buffer_attr * output_att;
      output_att = WRAP(pa_stream_get_buffer_attr)(stm->output_stream);
      LOG("Output buffer attributes maxlength %u, tlength %u, prebuf %u, "
          "minreq %u, fragsize %u",
          output_att->maxlength, output_att->tlength, output_att->prebuf,
          output_att->minreq, output_att->fragsize);
    }

    if (input_stream_params) {
      const pa_buffer_attr * input_att;
      input_att = WRAP(pa_stream_get_buffer_attr)(stm->input_stream);
      LOG("Input buffer attributes maxlength %u, tlength %u, prebuf %u, minreq "
          "%u, fragsize %u",
          input_att->maxlength, input_att->tlength, input_att->prebuf,
          input_att->minreq, input_att->fragsize);
    }
  }

  *stream = stm;
  LOG("Cubeb stream (%p) init successful.", *stream);

  return CUBEB_OK;
}